

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequence.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *s,QKeySequence *keysequence)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  quint32 *pqVar4;
  long in_FS_OFFSET;
  char local_70 [24];
  char *local_58;
  quint32 c;
  quint32 keys [4];
  uint local_38 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&c);
  pqVar4 = keys;
  keys[0] = 0;
  keys[1] = 0;
  keys[2] = 0;
  keys[3] = 0;
  uVar3 = 0;
  while( true ) {
    uVar2 = (ulong)c;
    if (3 < c) {
      uVar2 = 4;
    }
    if (uVar2 <= uVar3) break;
    cVar1 = QDataStream::atEnd();
    if (cVar1 != '\0') {
      local_70[0] = '\x02';
      local_70[1] = '\0';
      local_70[2] = '\0';
      local_70[3] = '\0';
      local_70[0x14] = '\0';
      local_70[0x15] = '\0';
      local_70[0x16] = '\0';
      local_70[0x17] = '\0';
      local_70[4] = '\0';
      local_70[5] = '\0';
      local_70[6] = '\0';
      local_70[7] = '\0';
      local_70[8] = '\0';
      local_70[9] = '\0';
      local_70[10] = '\0';
      local_70[0xb] = '\0';
      local_70[0xc] = '\0';
      local_70[0xd] = '\0';
      local_70[0xe] = '\0';
      local_70[0xf] = '\0';
      local_70[0x10] = '\0';
      local_70[0x11] = '\0';
      local_70[0x12] = '\0';
      local_70[0x13] = '\0';
      local_58 = "default";
      QMessageLogger::warning(local_70,"Premature EOF while reading QKeySequence");
LAB_00509296:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return s;
      }
      __stack_chk_fail();
    }
    QDataStream::operator>>(s,(int *)pqVar4);
    uVar3 = uVar3 + 1;
    pqVar4 = pqVar4 + 1;
  }
  qAtomicDetach<QKeySequencePrivate>(&keysequence->d);
  std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<unsigned_int*,int*>
            (keys,local_38,keysequence->d->key);
  goto LAB_00509296;
}

Assistant:

QDataStream &operator>>(QDataStream &s, QKeySequence &keysequence)
{
    const quint32 MaxKeys = QKeySequencePrivate::MaxKeyCount;
    quint32 c;
    s >> c;
    quint32 keys[MaxKeys] = {0};
    for (uint i = 0; i < qMin(c, MaxKeys); ++i) {
        if (s.atEnd()) {
            qWarning("Premature EOF while reading QKeySequence");
            return s;
        }
        s >> keys[i];
    }
    qAtomicDetach(keysequence.d);
    std::copy(keys, keys + MaxKeys, QT_MAKE_CHECKED_ARRAY_ITERATOR(keysequence.d->key, MaxKeys));
    return s;
}